

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::createConnection<slang::ast::MultiPortSymbol>
          (PortConnectionBuilder *this,MultiPortSymbol *port,PropertyExprSyntax *syntax,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  LookupLocation lookupLocation;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  bool bVar1;
  ExpressionSyntax *pEVar2;
  long in_RSI;
  SourceLocation in_RDI;
  PortConnection *in_R8;
  PortConnection *conn;
  ExpressionSyntax *exprSyntax;
  ASTContext context;
  Diagnostic *diag;
  MultiPortSymbol *in_stack_ffffffffffffff18;
  MultiPortSymbol *port_00;
  PortConnectionBuilder *in_stack_ffffffffffffff20;
  PortConnectionBuilder *this_00;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff30;
  DiagCode noteCode;
  Scope *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff50;
  SyntaxNode *in_stack_ffffffffffffff70;
  Compilation *local_8;
  
  if ((*(byte *)(in_RSI + 0x54) & 1) == 0) {
    port_00 = *(MultiPortSymbol **)in_RDI;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff50,NonProcedural);
    lookupLocation._8_8_ = in_stack_ffffffffffffff40;
    lookupLocation.scope = in_stack_ffffffffffffff38;
    ASTContext::ASTContext
              ((ASTContext *)in_RDI,(Scope *)in_stack_ffffffffffffff20,lookupLocation,
               in_stack_ffffffffffffff30);
    pEVar2 = ASTContext::requireSimpleExpr
                       ((ASTContext *)in_stack_ffffffffffffff20,(PropertyExprSyntax *)port_00);
    if (pEVar2 == (ExpressionSyntax *)0x0) {
      local_8 = (Compilation *)emptyConnection(in_stack_ffffffffffffff20,port_00);
    }
    else {
      local_8 = (Compilation *)
                BumpAllocator::
                emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::syntax::ExpressionSyntax_const&>
                          ((BumpAllocator *)in_stack_ffffffffffffff30.m_bits,
                           (MultiPortSymbol *)in_RDI,(ExpressionSyntax *)in_stack_ffffffffffffff20);
      bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                        ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                         0x4f6bbb);
      if (!bVar1) {
        attributes_00._M_extent._M_extent_value = in_stack_ffffffffffffff50._M_extent_value;
        attributes_00._M_ptr = (pointer)pEVar2;
        Compilation::setAttributes(local_8,in_R8,attributes_00);
      }
    }
  }
  else {
    this_00 = *(PortConnectionBuilder **)in_RDI;
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff70);
    noteCode = SUB84(in_stack_ffffffffffffff30.m_bits >> 0x20,0);
    Scope::addDiag((Scope *)context._8_8_,context.firstTempVar._4_4_,(SourceRange)context._16_16_);
    Diagnostic::addNote((Diagnostic *)this_00,noteCode,in_RDI);
    local_8 = (Compilation *)emptyConnection(this_00,in_stack_ffffffffffffff18);
  }
  return (PortConnection *)local_8;
}

Assistant:

PortConnection* createConnection(const TPort& port, const PropertyExprSyntax& syntax,
                                     std::span<const AttributeSymbol* const> attributes) {
        // If this is an empty port, it's an error to provide an expression.
        if (port.isNullPort) {
            auto& diag = scope.addDiag(diag::NullPortExpression, syntax.sourceRange());
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return emptyConnection(port);
        }

        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto exprSyntax = context.requireSimpleExpr(syntax);
        if (!exprSyntax)
            return emptyConnection(port);

        auto conn = comp.emplace<PortConnection>(port, *exprSyntax);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }